

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

void init_mstdin(void)

{
  char *pcVar1;
  
  if (init_mstdin::done_stdin == 0) {
    pcVar1 = mfload(_stdin,(char *)0x0,&m_channel[0]->size,1);
    m_channel[0]->data = pcVar1;
    m_channel[0]->mode = 1;
    init_mstdin::done_stdin = 1;
  }
  return;
}

Assistant:

static void init_mstdin(void) {
    static int done_stdin = 0;
    if (done_stdin)
	return;

    m_channel[0]->data = mfload(stdin, NULL, &m_channel[0]->size, 1);
    m_channel[0]->mode = MF_READ;
    done_stdin = 1;
}